

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O2

int vpx_rac_get(VpxRangeCoder *c)

{
  int iVar1;
  
  iVar1 = vpx_rac_get_prob(c,0x80);
  return iVar1;
}

Assistant:

int vpx_rac_get(VpxRangeCoder *c)
{
    return vpx_rac_get_prob(c, 128);
}